

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O2

void __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
~Sequencer(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *this)

{
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&(this->gating_sequences_).
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}